

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  element_type *this_00;
  Registry *pRVar5;
  Status SVar6;
  bool bVar7;
  CommissionerAppMock *this_01;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_03;
  undefined8 *puVar8;
  long *plVar9;
  _func_int **message;
  char *pcVar10;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_54a;
  Status local_549;
  _Any_data local_548;
  undefined1 local_538 [16];
  _Any_data local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_518;
  code *pcStack_510;
  _Any_data local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e0 [8];
  undefined **local_4d8;
  undefined1 local_4d0 [8];
  undefined1 auStack_4c8 [16];
  _Alloc_hider local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  element_type local_4a8 [2];
  internal local_498;
  undefined7 uStack_497;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  Value value;
  _Any_data local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_428;
  code *pcStack_420;
  ByteArray local_418;
  CommissionerAppMockPtr commissionerAppMock;
  string local_3d8;
  string local_3b8;
  State local_398;
  State local_394;
  _func_int **local_390;
  string mepdsFileName;
  UnixTime local_368;
  UnixTime local_360;
  string multiEntryPendingDataset;
  Error local_338;
  Error local_310;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  multiEntryPendingDataset._M_dataplus._M_p = (pointer)&multiEntryPendingDataset.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&multiEntryPendingDataset,
             "\n{\n  \"1122334455667788\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  },\n  \"99AABBCCDDEEFF00\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n    \"NetworkName\": \"net9\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  }\n}"
             ,"");
  mepdsFileName._M_dataplus._M_p = (pointer)&mepdsFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mepdsFileName,"./mepds.json","");
  ot::commissioner::WriteFile((Error *)&br,&multiEntryPendingDataset,&mepdsFileName);
  local_4e0._0_4_ = br._vptr_BorderRouter._0_4_;
  local_548._M_unused._M_member_pointer = (ulong)(uint)local_548._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&value,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",(ErrorCode *)local_4e0,(ErrorCode *)local_548._M_pod_data);
  if ((string *)CONCAT44(br.mNetworkId.mId,br.mId.mId) != &br.mAgent.mAddr) {
    operator_delete((undefined1 *)CONCAT44(br.mNetworkId.mId,br.mId.mId));
  }
  _Var4._M_p = value.mError.mMessage._M_dataplus._M_p;
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&br);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xbfa,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4e0,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e0);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    local_490 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                value.mError.mMessage._M_dataplus._M_p;
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_001a21d6;
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
  }
  else {
    if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
    value.mError.mCode = kNone;
    value.mError._4_4_ = 0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
    if ((char)br._vptr_BorderRouter == '\0') {
      testing::Message::Message((Message *)&value);
      if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_4e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xbfc,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_4e0,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e0);
      if (value.mError._0_8_ != 0) {
        (**(code **)(*(long *)value.mError._0_8_ + 8))();
      }
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(br.mNetworkId.mId,br.mId.mId);
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a21d6;
      local_490 = p_Var2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_vptr__Sp_counted_base !=
          p_Var2 + 1) {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        p_Var2->_vptr__Sp_counted_base);
      }
    }
    else {
      puVar8 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
      if (puVar8 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar8 != puVar8 + 2) {
          operator_delete((undefined8 *)*puVar8);
        }
        operator_delete(puVar8);
      }
      pRVar5 = ctx.mRegistry;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
      local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4e0 = (undefined1  [8])local_4d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_394,0,0,0,0,0);
      local_548._M_unused._M_object = local_538;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"net1","");
      local_508._M_unused._M_object = &local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
      local_528._M_unused._M_object = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
      local_438._M_unused._M_object = &local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"domain1","");
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      message = (_func_int **)0x2ff875;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"","");
      ot::commissioner::UnixTime::UnixTime(&local_360,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&value,0x4e21,&local_418,(string *)local_4e0,local_394
                 ,(string *)&local_548,0x1122334455667788,(string *)&local_508,(string *)&local_528,
                 (Timestamp)0x0,0,(string *)&local_438,(ByteArray *)&commissionerAppMock,&local_3d8,
                 '\0',0,&local_3b8,local_360,0x101f);
      local_549 = ot::commissioner::persistent_storage::Registry::Add(pRVar5,(BorderAgent *)&br);
      local_54a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (&local_498,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_549,&local_54a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        operator_delete(commissionerAppMock.
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_438._M_unused._0_8_ != &local_428)
      {
        operator_delete(local_438._M_unused._M_object);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_528._M_unused._0_8_ != &local_518)
      {
        operator_delete(local_528._M_unused._M_object);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_unused._0_8_ != &local_4f8) {
        operator_delete(local_508._M_unused._M_object);
      }
      if ((undefined1 *)local_548._M_unused._0_8_ != local_538) {
        operator_delete(local_548._M_unused._M_object);
      }
      if (local_4e0 != (undefined1  [8])local_4d0) {
        operator_delete((void *)local_4e0);
      }
      if (local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      p_Var2 = local_490;
      if (local_498 == (internal)0x0) {
        testing::Message::Message((Message *)&br);
        if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          message = local_490->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc00,(char *)message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (local_490 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a21d6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_490->_vptr__Sp_counted_base !=
            local_490 + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_490->_vptr__Sp_counted_base);
        }
      }
      else {
        if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_490->_vptr__Sp_counted_base !=
              local_490 + 1) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_490->_vptr__Sp_counted_base);
          }
          operator_delete(p_Var2);
        }
        pRVar5 = ctx.mRegistry;
        value.mError._0_8_ = &value.mError.mMessage._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
        local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_4e0 = (undefined1  [8])local_4d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_398,0,0,0,0,0);
        local_548._M_unused._M_object = local_538;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"net2","");
        local_508._M_unused._M_object = &local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
        local_528._M_unused._M_object = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
        local_438._M_unused._M_object = &local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"domain2","");
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        local_390 = (_func_int **)0x2ff875;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8);
        ot::commissioner::UnixTime::UnixTime(&local_368,0);
        pcVar10 = (char *)(ulong)(uint)local_398;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&br,(string *)&value,0x4e22,&local_418,(string *)local_4e0,
                   local_398,(string *)&local_548,0x99aabbccddeeff00,(string *)&local_508,
                   (string *)&local_528,(Timestamp)0x0,0,(string *)&local_438,
                   (ByteArray *)&commissionerAppMock,&local_3d8,'\0',0,&local_3b8,local_368,0x101f);
        local_549 = ot::commissioner::persistent_storage::Registry::Add(pRVar5,(BorderAgent *)&br);
        local_54a = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  (&local_498,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_549,&local_54a);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p);
        }
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          operator_delete(commissionerAppMock.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         );
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_438._M_unused._0_8_ != &local_428
           ) {
          operator_delete(local_438._M_unused._M_object);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_528._M_unused._0_8_ != &local_518
           ) {
          operator_delete(local_528._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_unused._0_8_ != &local_4f8) {
          operator_delete(local_508._M_unused._M_object);
        }
        if ((undefined1 *)local_548._M_unused._0_8_ != local_538) {
          operator_delete(local_548._M_unused._M_object);
        }
        if (local_4e0 != (undefined1  [8])local_4d0) {
          operator_delete((void *)local_4e0);
        }
        if (local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_418.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
          operator_delete((void *)value.mError._0_8_);
        }
        p_Var2 = local_490;
        if (local_498 != (internal)0x0) {
          if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_490->_vptr__Sp_counted_base !=
                local_490 + 1) {
              operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              local_490->_vptr__Sp_counted_base);
            }
            operator_delete(p_Var2);
          }
          ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
          br.mNetworkId.mId = value.mError.mCode;
          SVar6 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                            (ctx.mRegistry,&br);
          local_4e0[0] = SVar6;
          local_548._M_unused._M_member_pointer =
               local_548._M_unused._M_member_pointer & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                     "RegistryStatus::kSuccess",local_4e0,(Status *)local_548._M_pod_data);
          _Var4 = value.mError.mMessage._M_dataplus;
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4e0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_548,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc07,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_548,(Message *)local_4e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
            if (local_4e0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4e0 + 8))();
            }
            _Var4._M_p = value.mError.mMessage._M_dataplus._M_p;
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(_Var4._M_p);
            }
          }
          else {
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(_Var4._M_p);
            }
            this_01 = (CommissionerAppMock *)operator_new(0x1838);
            memset(this_01,0,0x1838);
            CommissionerAppMock::CommissionerAppMock(this_01);
            commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = this_01;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                      (&commissionerAppMock.
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,this_01);
            local_3d8._M_string_length = (size_type)operator_new(8);
            (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
             local_3d8._M_string_length)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_0039a928
            ;
            local_3d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_3d8.field_2._M_allocated_capacity,
                       (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                       local_3d8._M_string_length);
            local_3d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395cd8;
            local_3b8._M_string_length = (size_type)operator_new(8);
            (((MatcherInterface<const_ot::commissioner::Config_&> *)local_3b8._M_string_length)->
            super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                 (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
            local_3b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_3b8.field_2._M_allocated_capacity,
                       (MatcherInterface<const_ot::commissioner::Config_&> *)
                       local_3b8._M_string_length);
            local_3b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d40;
            CommissionerAppStaticExpecter::gmock_Create
                      ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)local_4e0,&ctx.mCommissionerAppStaticExpecter,
                       (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_3d8,
                       (Matcher<const_ot::commissioner::Config_&> *)&local_3b8);
            testing::internal::GetWithoutMatchers();
            this_02 = testing::internal::
                      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)local_4e0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0a,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
            paVar1 = &local_310.mMessage.field_2;
            local_310.mCode = kNone;
            local_310.mMessage._M_string_length = 0;
            local_310.mMessage.field_2._M_local_buf[0] = '\0';
            local_310.mMessage._M_dataplus._M_p = (pointer)paVar1;
            testing::Return<ot::commissioner::Error>((testing *)&local_498,&local_310);
            local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_497,local_498);
            local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_490;
            if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_490->_M_use_count = local_490->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_490->_M_use_count = local_490->_M_use_count + 1;
              }
            }
            local_548._M_unused._M_object = &commissionerAppMock;
            local_548._8_8_ = 0;
            local_538._0_8_ =
                 std::
                 _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3084:30)>
                 ::_M_manager;
            local_538._8_8_ =
                 std::
                 _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3084:30)>
                 ::_M_invoke;
            local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_548._M_unused._0_8_;
            std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                      ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                       &local_508,
                       (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                       &local_548);
            local_518 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pcStack_510 = (code *)0x0;
            local_528._M_unused._M_object = (void *)0x0;
            local_528._8_8_ = 0;
            local_528._M_unused._M_object = operator_new(0x20);
            *(undefined8 *)local_528._M_unused._0_8_ = 0;
            *(undefined8 *)((long)local_528._M_unused._0_8_ + 8) = 0;
            *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x10) = 0;
            *(undefined8 *)((long)local_528._M_unused._0_8_ + 0x18) = local_4f8._8_8_;
            if (local_4f8._M_allocated_capacity != 0) {
              *(undefined4 *)local_528._M_unused._0_8_ = local_508._0_4_;
              *(undefined4 *)((long)local_528._M_unused._0_8_ + 4) = local_508._4_4_;
              *(undefined4 *)((long)local_528._M_unused._0_8_ + 8) = local_508._8_4_;
              *(undefined4 *)((long)local_528._M_unused._0_8_ + 0xc) = local_508._12_4_;
              *(size_type *)((long)local_528._M_unused._0_8_ + 0x10) =
                   local_4f8._M_allocated_capacity;
            }
            local_528._8_8_ = 0;
            local_518 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        std::_Function_handler::operator_cast_to_Action;
            pcStack_510 = std::_Function_handler::operator_cast_to_Action;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(code *)local_538._0_8_)(&local_548,&local_548,3);
            }
            __l._M_len = 1;
            __l._M_array = (iterator)&local_528;
            std::
            vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                      *)&value,__l,(allocator_type *)local_548._M_pod_data);
            if (local_518 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(code *)local_518)(&local_528,&local_528,3);
            }
            __return_storage_ptr__ = &value.mError.mMessage.field_2;
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)__return_storage_ptr__,(ReturnAction *)&local_418);
            local_428 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pcStack_420 = (code *)0x0;
            local_438._M_unused._M_object = (void *)0x0;
            local_438._8_8_ = 0;
            local_438._M_unused._M_object = operator_new(0x38);
            *(undefined8 *)local_438._M_unused._0_8_ = value.mError._0_8_;
            *(pointer *)((long)local_438._M_unused._0_8_ + 8) =
                 value.mError.mMessage._M_dataplus._M_p;
            *(size_type *)((long)local_438._M_unused._0_8_ + 0x10) =
                 value.mError.mMessage._M_string_length;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mCode = kNone;
            value.mError._4_4_ = 0;
            value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_438._M_unused._0_8_ + 0x28) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_438._M_unused._0_8_ + 0x18) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_438._M_unused._0_8_ + 0x20) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(size_type *)((long)local_438._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
            if (value.mData._M_dataplus._M_p != (pointer)0x0) {
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_438._M_unused._0_8_ + 0x18) =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                            value.mError.mMessage.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_438._M_unused._0_8_ + 0x20) =
                   value.mError.mMessage.field_2._8_8_;
              *(pointer *)((long)local_438._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
              value.mData._M_dataplus._M_p = (pointer)0x0;
              value.mData._M_string_length = 0;
            }
            local_438._8_8_ = 0;
            local_428 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        std::_Function_handler::operator_cast_to_Action;
            pcStack_420 = std::_Function_handler::operator_cast_to_Action;
            std::
            vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                       *)&value);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            ::WillOnce(this_02,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                *)&local_438);
            if (local_428 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(code *)local_428)(&local_438,&local_438,3);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310.mMessage._M_dataplus._M_p != paVar1) {
              operator_delete(local_310.mMessage._M_dataplus._M_p);
            }
            auStack_4c8._8_8_ = &PTR__MatcherBase_00395d20;
            if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0._M_pi);
            }
            local_4d8 = &PTR__MatcherBase_00395d88;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4c8._0_8_);
            }
            local_3b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d88;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_3b8.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_3b8.field_2._M_allocated_capacity);
            }
            local_3d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_3d8.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_3d8.field_2._M_allocated_capacity);
            }
            this_00 = commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_548._8_8_ = operator_new(8);
            (((MatcherInterface<const_ot::commissioner::ActiveOperationalDataset_&> *)
             local_548._8_8_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                 (_func_int **)&PTR__MatcherDescriberInterface_0039af70;
            local_548._M_unused._M_object = &PTR__MatcherBase_00398350;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_const&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_538,
                       (MatcherInterface<const_ot::commissioner::ActiveOperationalDataset_&> *)
                       local_548._8_8_);
            local_548._M_unused._M_object = &PTR__MatcherBase_00398308;
            CommissionerAppMock::gmock_SetActiveDataset
                      ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)&value,this_00,
                       (Matcher<const_ot::commissioner::ActiveOperationalDataset_&> *)&local_548);
            testing::internal::GetWithoutMatchers();
            this_03 = testing::internal::
                      MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                  *)&value,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0d,"*commissionerAppMock","SetActiveDataset(_)");
            paVar1 = &local_338.mMessage.field_2;
            local_338.mCode = kNone;
            local_338.mMessage._M_string_length = 0;
            local_338.mMessage.field_2._M_local_buf[0] = '\0';
            local_338.mMessage._M_dataplus._M_p = (pointer)paVar1;
            testing::Return<ot::commissioner::Error>((testing *)local_508._M_pod_data,&local_338);
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)local_4e0,(ReturnAction *)local_508._M_pod_data);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
            ::WillOnce(this_03,(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                *)local_4e0);
            if (local_4d0 != (undefined1  [8])0x0) {
              (*(code *)local_4d0)(local_4e0,local_4e0,3);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.mMessage._M_dataplus._M_p != paVar1) {
              operator_delete(local_338.mMessage._M_dataplus._M_p);
            }
            value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00398350;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                         value.mError.mMessage.field_2._M_local_buf[0]) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                                  value.mError.mMessage.field_2._M_local_buf[0]));
            }
            local_548._M_unused._M_object = &PTR__MatcherBase_00398350;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_);
            }
            local_518 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_528._M_unused._M_object = (void *)0x0;
            local_528._8_8_ = 0;
            paVar1 = &value.mData.field_2;
            value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mMessage.field_2._M_local_buf[0] = '\0';
            value.mData._M_string_length = 0;
            value.mData.field_2._M_local_buf[0] = '\0';
            local_4e0 = (undefined1  [8])local_4d0;
            value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
            value.mData._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"start","");
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_508,&ctx.mInterpreter,(string *)local_4e0);
            local_538._0_8_ = local_518;
            local_548._8_8_ = local_528._8_8_;
            local_548._M_unused._0_8_ = local_528._M_unused._0_8_;
            local_518 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_4f8._M_allocated_capacity;
            local_528._M_unused._M_object = local_508._M_unused._M_object;
            local_528._8_8_ = local_508._8_8_;
            local_508._M_unused._M_object = (long *)0x0;
            local_508._8_8_ = 0;
            local_4f8._M_allocated_capacity = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_548);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_508);
            if (local_4e0 != (undefined1  [8])local_4d0) {
              operator_delete((void *)local_4e0);
            }
            ot::commissioner::Interpreter::Eval
                      ((Value *)local_4e0,&ctx.mInterpreter,(Expression *)&local_528);
            bVar7 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_4e0);
            local_548._M_pod_data[0] = bVar7;
            local_548._8_8_ = (undefined8 *)0x0;
            if ((element_type *)local_4b8._M_p != local_4a8) {
              operator_delete(local_4b8._M_p);
            }
            if (local_4d8 != (undefined **)auStack_4c8) {
              operator_delete(local_4d8);
            }
            if (local_548._M_pod_data[0] == '\0') {
              testing::Message::Message((Message *)&local_508);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4e0,(internal *)local_548._M_pod_data,
                         (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false",
                         "true",pcVar10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_438,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc12,(char *)local_4e0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_438,(Message *)&local_508);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
              if (local_4e0 != (undefined1  [8])local_4d0) {
                operator_delete((void *)local_4e0);
              }
              if ((long *)local_508._M_unused._0_8_ != (long *)0x0) {
                (**(code **)(*local_508._M_unused._M_object + 8))();
              }
            }
            uVar3 = local_548._8_8_;
            if ((undefined8 *)local_548._8_8_ != (undefined8 *)0x0) {
              if (*(undefined8 **)local_548._8_8_ != (undefined8 *)(local_548._8_8_ + 0x10)) {
                operator_delete(*(undefined8 **)local_548._8_8_);
              }
              operator_delete((void *)uVar3);
            }
            ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                      ((MultiNetCommandContext *)&ctx);
            ot::commissioner::JobManager::CleanupJobs
                      (ctx.mInterpreter.mJobManager.
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            local_548._M_unused._M_object = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_538;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_548,"opdataset set active --import ","");
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               (local_548._M_pod_data,(ulong)mepdsFileName._M_dataplus._M_p);
            local_4e0 = (undefined1  [8])local_4d0;
            plVar9 = puVar8 + 2;
            if ((long *)*puVar8 == plVar9) {
              local_4d0 = (undefined1  [8])*plVar9;
              auStack_4c8._0_8_ = puVar8[3];
            }
            else {
              local_4d0 = (undefined1  [8])*plVar9;
              local_4e0 = (undefined1  [8])*puVar8;
            }
            local_4d8 = (undefined **)puVar8[1];
            *puVar8 = plVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_438,&ctx.mInterpreter,(string *)local_4e0);
            local_4f8._M_allocated_capacity = (size_type)local_518;
            local_508._8_8_ = local_528._8_8_;
            local_508._M_unused._0_8_ = local_528._M_unused._0_8_;
            local_518 = local_428;
            local_528._M_unused._M_object = local_438._M_unused._M_object;
            local_528._8_8_ = local_438._8_8_;
            local_438._M_unused._M_object = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)0x0;
            local_438._8_8_ = 0;
            local_428 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_508);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_438);
            if (local_4e0 != (undefined1  [8])local_4d0) {
              operator_delete((void *)local_4e0);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_548._M_unused._0_8_ !=
                (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_538) {
              operator_delete(local_548._M_unused._M_object);
            }
            ot::commissioner::Interpreter::Eval
                      ((Value *)local_4e0,&ctx.mInterpreter,(Expression *)&local_528);
            value.mError.mCode = local_4e0._0_4_;
            std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_4d8);
            std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_4b8);
            if ((element_type *)local_4b8._M_p != local_4a8) {
              operator_delete(local_4b8._M_p);
            }
            if (local_4d8 != (undefined **)auStack_4c8) {
              operator_delete(local_4d8);
            }
            bVar7 = ot::commissioner::Interpreter::Value::HasNoError(&value);
            local_548._M_pod_data[0] = bVar7;
            local_548._8_8_ = (undefined8 *)0x0;
            if (!bVar7) {
              testing::Message::Message((Message *)&local_508);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4e0,(internal *)local_548._M_pod_data,
                         (AssertionResult *)0x2ddeee,"false","true",pcVar10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_438,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc18,(char *)local_4e0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_438,(Message *)&local_508);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
              if (local_4e0 != (undefined1  [8])local_4d0) {
                operator_delete((void *)local_4e0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_unused._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*local_508._M_unused._M_object + 8))();
              }
              uVar3 = local_548._8_8_;
              if ((undefined8 *)local_548._8_8_ != (undefined8 *)0x0) {
                if (*(undefined8 **)local_548._8_8_ != (undefined8 *)(local_548._8_8_ + 0x10)) {
                  operator_delete(*(undefined8 **)local_548._8_8_);
                }
                operator_delete((void *)uVar3);
              }
            }
            unlink(mepdsFileName._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mData._M_dataplus._M_p != paVar1) {
              operator_delete(value.mData._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mError.mMessage._M_dataplus._M_p != __return_storage_ptr__) {
              operator_delete(value.mError.mMessage._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_528);
            if (commissionerAppMock.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (commissionerAppMock.
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
          ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
          goto LAB_001a21d6;
        }
        testing::Message::Message((Message *)&br);
        if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_390 = local_490->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc04,(char *)local_390);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (local_490 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a21d6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_490->_vptr__Sp_counted_base !=
            local_490 + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_490->_vptr__Sp_counted_base);
        }
      }
    }
  }
  operator_delete(local_490);
LAB_001a21d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mepdsFileName._M_dataplus._M_p != &mepdsFileName.field_2) {
    operator_delete(mepdsFileName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)multiEntryPendingDataset._M_dataplus._M_p != &multiEntryPendingDataset.field_2) {
    operator_delete(multiEntryPendingDataset._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_MultiEntryImportImplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
  \"1122334455667788\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  },\n\
  \"99AABBCCDDEEFF00\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n\
    \"NetworkName\": \"net9\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}